

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

void __thiscall DOMTest::findTestNodes(DOMTest *this,DOMDocument *document)

{
  DOMElement *pDVar1;
  undefined4 uVar2;
  int iVar3;
  
  if (document != (DOMDocument *)0x0) {
    pDVar1 = (DOMElement *)(document + 0x18);
    iVar3 = 0;
    while (iVar3 < 0xc) {
      uVar2 = (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1);
      switch(uVar2) {
      case 1:
        if (testElementNode == (DOMElement *)0x0) {
          iVar3 = iVar3 + 1;
          testElementNode = pDVar1;
        }
        break;
      case 2:
        if (testAttributeNode == (DOMAttr *)0x0) {
          iVar3 = iVar3 + 1;
          testAttributeNode = (DOMAttr *)pDVar1;
        }
        break;
      case 3:
        if (testTextNode == (DOMText *)0x0) {
          iVar3 = iVar3 + 1;
          testTextNode = (DOMText *)pDVar1;
        }
        break;
      case 4:
        if (testCDATASectionNode == (DOMCDATASection *)0x0) {
          iVar3 = iVar3 + 1;
          testCDATASectionNode = (DOMCDATASection *)pDVar1;
        }
        break;
      case 5:
        if (testEntityReferenceNode == (DOMEntityReference *)0x0) {
          iVar3 = iVar3 + 1;
          testEntityReferenceNode = (DOMEntityReference *)pDVar1;
        }
        break;
      case 6:
        if (testEntityNode == (DOMEntity *)0x0) {
          iVar3 = iVar3 + 1;
          testEntityNode = (DOMEntity *)pDVar1;
        }
        break;
      case 7:
        if (testProcessingInstructionNode == (DOMProcessingInstruction *)0x0) {
          iVar3 = iVar3 + 1;
          testProcessingInstructionNode = (DOMProcessingInstruction *)pDVar1;
        }
        break;
      case 8:
        if (testCommentNode == (DOMComment *)0x0) {
          iVar3 = iVar3 + 1;
          testCommentNode = (DOMComment *)pDVar1;
        }
        break;
      case 9:
        if (testDocumentNode == (DOMDocument *)0x0) {
          iVar3 = iVar3 + 1;
          testDocumentNode = document;
        }
        break;
      case 10:
        if (testDocumentTypeNode == (DOMDocumentType *)0x0) {
          iVar3 = iVar3 + 1;
          testDocumentTypeNode = (DOMDocumentType *)pDVar1;
        }
        break;
      case 0xb:
        if (testDocumentFragmentNode == (DOMDocumentFragment *)0x0) {
          iVar3 = iVar3 + 1;
          testDocumentFragmentNode = (DOMDocumentFragment *)pDVar1;
        }
        break;
      case 0xc:
        if (testNotationNode == (DOMNotation *)0x0) {
          iVar3 = iVar3 + 1;
          testNotationNode = (DOMNotation *)pDVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void DOMTest::findTestNodes(DOMDocument* document) {
    DOMNode* node = document;
    int nodeCount = 0;

    // Walk the tree until you find and assign all node types needed that exist.
    while (node != 0 && nodeCount < 12)
    {

        switch (node->getNodeType())
    {
        case DOMNode::ELEMENT_NODE :
            if (testElementNode == 0) {testElementNode = (DOMElement*)node; nodeCount++;}
            break;
        case DOMNode::ATTRIBUTE_NODE :
            if (testAttributeNode == 0) {testAttributeNode = (DOMAttr*)node; nodeCount++;}
            break;
        case DOMNode::TEXT_NODE :
            if (testTextNode == 0) {testTextNode = (DOMText*)node; nodeCount++;}
            break;
        case DOMNode::CDATA_SECTION_NODE :
            if (testCDATASectionNode == 0) {testCDATASectionNode = (DOMCDATASection*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_REFERENCE_NODE :
            if (testEntityReferenceNode == 0) {testEntityReferenceNode = (DOMEntityReference*)node; nodeCount++;}
            break;
        case DOMNode::ENTITY_NODE :
            if (testEntityNode == 0) {testEntityNode = (DOMEntity*)node; nodeCount++;}
            break;
        case DOMNode::PROCESSING_INSTRUCTION_NODE :
            if (testProcessingInstructionNode == 0) {testProcessingInstructionNode = (DOMProcessingInstruction*)node; nodeCount++;}
            break;
        case DOMNode::COMMENT_NODE :
            if (testCommentNode == 0) {testCommentNode = (DOMComment*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_TYPE_NODE :
            if (testDocumentTypeNode == 0) {testDocumentTypeNode = (DOMDocumentType*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_FRAGMENT_NODE :
            if (testDocumentFragmentNode == 0) {testDocumentFragmentNode = (DOMDocumentFragment*)node; nodeCount++;}
            break;
        case DOMNode::NOTATION_NODE :
            if (testNotationNode == 0) {testNotationNode = (DOMNotation*)node; nodeCount++;}
            break;
        case DOMNode::DOCUMENT_NODE :
            if (testDocumentNode == 0) {testDocumentNode = (DOMDocument*)node; nodeCount++;}
            break;
        default:
            ;
    }// End of switch

    }   // End of while
}